

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockCheckedActualCall_unExpectedParameterName_Test::testBody
          (TEST_MockCheckedActualCall_unExpectedParameterName_Test *this)

{
  MockExpectedCallsList *pMVar1;
  MockActualCall *pMVar2;
  UtestShell *test;
  SimpleString local_1d0;
  MockUnexpectedInputParameterFailure expectedFailure;
  MockNamedValue parameter;
  MockCheckedActualCall actualCall;
  MockCheckedExpectedCall call1;
  
  MockCheckedExpectedCall::MockCheckedExpectedCall(&call1);
  SimpleString::SimpleString((SimpleString *)&expectedFailure,"func");
  MockCheckedExpectedCall::withName(&call1,(SimpleString *)&expectedFailure);
  SimpleString::~SimpleString((SimpleString *)&expectedFailure);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list;
  (*pMVar1->_vptr_MockExpectedCallsList[0xc])(pMVar1,&call1);
  MockCheckedActualCall::MockCheckedActualCall
            (&actualCall,1,(this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).reporter,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list);
  SimpleString::SimpleString((SimpleString *)&expectedFailure,"func");
  pMVar2 = MockCheckedActualCall::withName(&actualCall,(SimpleString *)&expectedFailure);
  SimpleString::SimpleString((SimpleString *)&parameter,"integer");
  (*pMVar2->_vptr_MockActualCall[8])(pMVar2,&parameter,1);
  SimpleString::~SimpleString((SimpleString *)&parameter);
  SimpleString::~SimpleString((SimpleString *)&expectedFailure);
  SimpleString::SimpleString((SimpleString *)&expectedFailure,"integer");
  MockNamedValue::MockNamedValue(&parameter,(SimpleString *)&expectedFailure);
  SimpleString::~SimpleString((SimpleString *)&expectedFailure);
  MockNamedValue::setValue(&parameter,1);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_1d0,"func");
  MockUnexpectedInputParameterFailure::MockUnexpectedInputParameterFailure
            (&expectedFailure,test,&local_1d0,&parameter,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list);
  SimpleString::~SimpleString(&local_1d0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            (&expectedFailure.super_MockFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x79);
  TestFailure::~TestFailure((TestFailure *)&expectedFailure);
  MockNamedValue::~MockNamedValue(&parameter);
  MockCheckedActualCall::~MockCheckedActualCall(&actualCall);
  MockCheckedExpectedCall::~MockCheckedExpectedCall(&call1);
  return;
}

Assistant:

TEST(MockCheckedActualCall, unExpectedParameterName)
{
    MockCheckedExpectedCall call1;
    call1.withName("func");
    list->addExpectedCall(&call1);

    MockCheckedActualCall actualCall(1, reporter, *list);
    actualCall.withName("func").withParameter("integer", 1);

    MockNamedValue parameter("integer");
    parameter.setValue(1);

    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "func", parameter, *list);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}